

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O1

void ClearGamefield(Gamefield *gamefield)

{
  uint uVar1;
  uint uVar2;
  Pixel *pPVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  uVar1 = gamefield->height;
  if ((ulong)uVar1 != 0) {
    uVar2 = gamefield->width;
    lVar4 = (ulong)uVar2 * 0x14;
    lVar5 = 8;
    uVar6 = 0;
    do {
      if (uVar2 != 0) {
        pPVar3 = gamefield->pixels;
        lVar7 = 0;
        do {
          (&(pPVar3->color).r)[lVar7 + lVar5] = '\0';
          *(undefined8 *)((long)pPVar3 + lVar7 + lVar5 + -8) = 0x2ff000000;
          lVar7 = lVar7 + 0x14;
        } while (lVar4 != lVar7);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + lVar4;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

void ClearGamefield(Gamefield *gamefield) {
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber = 0;
            gamefield->pixels[y * gamefield->width + x].pixelType = Empty;
            gamefield->pixels[y * gamefield->width + x].color.r = 0;
            gamefield->pixels[y * gamefield->width + x].color.g = 0;
            gamefield->pixels[y * gamefield->width + x].color.b = 0;
            gamefield->pixels[y * gamefield->width + x].color.a = 255;
        }
    }
}